

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ssize_t ossl_send(Curl_cfilter *cf,Curl_easy *data,void *mem,size_t len,CURLcode *curlcode)

{
  uint err_00;
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  uint *puVar5;
  int local_160;
  int sockerr;
  ossl_ctx *octx;
  ssl_connect_data *connssl;
  int rc;
  int memlen;
  sslerr_t sslerror;
  char error_buffer [256];
  int err;
  CURLcode *curlcode_local;
  size_t len_local;
  void *mem_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  lVar2 = *(long *)((long)pvVar1 + 0x30);
  ERR_clear_error();
  *(undefined4 *)((long)pvVar1 + 0xb4) = 0;
  if (len < 0x80000000) {
    local_160 = (int)len;
  }
  else {
    local_160 = 0x7fffffff;
  }
  connssl._0_4_ = SSL_write(*(SSL **)(lVar2 + 8),mem,local_160);
  if ((int)connssl < 1) {
    error_buffer._252_4_ = SSL_get_error(*(SSL **)(lVar2 + 8),(int)connssl);
    switch(error_buffer._252_4_) {
    case 1:
      uVar3 = ERR_get_error();
      pcVar4 = ossl_strerror(uVar3,(char *)&sslerror,0x100);
      Curl_failf(data,"SSL_write() error: %s",pcVar4);
      *curlcode = CURLE_SEND_ERROR;
      connssl._0_4_ = -1;
      break;
    case 2:
      *(undefined4 *)((long)pvVar1 + 0xb4) = 1;
      *curlcode = CURLE_AGAIN;
      connssl._0_4_ = -1;
      break;
    case 3:
      *curlcode = CURLE_AGAIN;
      connssl._0_4_ = -1;
      break;
    default:
      pcVar4 = SSL_ERROR_to_str(error_buffer._252_4_);
      puVar5 = (uint *)__errno_location();
      Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",pcVar4,(ulong)*puVar5);
      *curlcode = CURLE_SEND_ERROR;
      connssl._0_4_ = -1;
      break;
    case 5:
      puVar5 = (uint *)__errno_location();
      err_00 = *puVar5;
      if (*(int *)(lVar2 + 0x20) == 0x51) {
        *curlcode = CURLE_AGAIN;
        connssl._0_4_ = -1;
      }
      else {
        uVar3 = ERR_get_error();
        if (uVar3 == 0) {
          if (err_00 == 0) {
            pcVar4 = SSL_ERROR_to_str(error_buffer._252_4_);
            curl_msnprintf((char *)&sslerror,0x100,"%s",pcVar4);
          }
          else {
            Curl_strerror(err_00,(char *)&sslerror,0x100);
          }
        }
        else {
          ossl_strerror(uVar3,(char *)&sslerror,0x100);
        }
        Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",&sslerror,(ulong)err_00);
        *curlcode = CURLE_SEND_ERROR;
        connssl._0_4_ = -1;
      }
    }
  }
  else {
    *curlcode = CURLE_OK;
  }
  return (long)(int)connssl;
}

Assistant:

static ssize_t ossl_send(struct Curl_cfilter *cf,
                         struct Curl_easy *data,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256];
  sslerr_t sslerror;
  int memlen;
  int rc;
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;

  (void)data;
  DEBUGASSERT(octx);

  ERR_clear_error();

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  rc = SSL_write(octx->ssl, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(octx->ssl, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
      connssl->io_need = CURL_SSL_IO_NEED_RECV;
      *curlcode = CURLE_AGAIN;
      rc = -1;
      goto out;
    case SSL_ERROR_WANT_WRITE:
      *curlcode = CURLE_AGAIN;
      rc = -1;
      goto out;
    case SSL_ERROR_SYSCALL:
    {
      int sockerr = SOCKERRNO;

      if(octx->io_result == CURLE_AGAIN) {
        *curlcode = CURLE_AGAIN;
        rc = -1;
        goto out;
      }
      sslerror = ERR_get_error();
      if(sslerror)
        ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
      else if(sockerr)
        Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
      else
        msnprintf(error_buffer, sizeof(error_buffer), "%s",
                  SSL_ERROR_to_str(err));

      failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
            error_buffer, sockerr);
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
    case SSL_ERROR_SSL: {
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      failf(data, "SSL_write() error: %s",
            ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
    default:
      /* a true error */
      failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
            SSL_ERROR_to_str(err), SOCKERRNO);
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
  }
  *curlcode = CURLE_OK;

out:
  return (ssize_t)rc; /* number of bytes */
}